

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O3

void __thiscall
despot::RandomPolicy::RandomPolicy
          (RandomPolicy *this,DSPOMDP *model,vector<double,_std::allocator<double>_> *action_probs,
          ParticleLowerBound *bound)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  DefaultPolicy::DefaultPolicy(&this->super_DefaultPolicy,model,bound);
  (this->super_DefaultPolicy).super_ScenarioLowerBound._vptr_ScenarioLowerBound =
       (_func_int **)&PTR__RandomPolicy_0018f360;
  std::vector<double,_std::allocator<double>_>::vector(&this->action_probs_,action_probs);
  pdVar1 = (action_probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(action_probs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar2 == 0) {
    dVar4 = -1.0;
  }
  else {
    lVar2 = lVar2 >> 3;
    dVar4 = 0.0;
    lVar3 = 0;
    do {
      dVar4 = dVar4 + pdVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
    dVar4 = dVar4 + -1.0;
  }
  if (ABS(dVar4) < 1e-08) {
    return;
  }
  __assert_fail("fabs(sum - 1.0) < 1.0e-8",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/core/builtin_policy.cpp"
                ,0x30,
                "despot::RandomPolicy::RandomPolicy(const DSPOMDP *, const vector<double> &, ParticleLowerBound *)"
               );
}

Assistant:

RandomPolicy::RandomPolicy(const DSPOMDP* model,
	const vector<double>& action_probs,
	ParticleLowerBound* bound) :
	DefaultPolicy(model, bound),
	action_probs_(action_probs) {
	double sum = 0;
	for (int i = 0; i < action_probs.size(); i++)
		sum += action_probs[i];
	assert(fabs(sum - 1.0) < 1.0e-8);
}